

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_repeat::build_graph(test_repeat *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = test_case::ggml_new_tensor_4d
                     (&this->super_test_case,ctx,this->type,
                      (long)(this->nr)._M_elems[0] * (this->ne)._M_elems[0],
                      (long)(this->nr)._M_elems[1] * (this->ne)._M_elems[1],
                      (long)(this->nr)._M_elems[2] * (this->ne)._M_elems[2],
                      (long)(this->nr)._M_elems[3] * (this->ne)._M_elems[3]);
  ggml_set_name(pgVar1,"target");
  pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_param(ctx,pgVar2);
  ggml_set_name(pgVar2,"src");
  pgVar1 = (ggml_tensor *)ggml_repeat(ctx,pgVar2,pgVar1);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * target = ggml_new_tensor_4d(ctx, type, ne[0]*nr[0], ne[1]*nr[1], ne[2]*nr[2], ne[3]*nr[3]);
        ggml_set_name(target, "target");

        ggml_tensor * src = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        ggml_tensor * out = ggml_repeat(ctx, src, target);
        ggml_set_name(out, "out");

        return out;
    }